

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

void __thiscall
pbrt::ImageTextureBase::ImageTextureBase
          (ImageTextureBase *this,TextureMapping2DHandle *mapping,string *filename,
          MIPMapFilterOptions filterOptions,WrapMode wrapMode,Float scale,bool invert,
          ColorEncodingHandle encoding,Allocator alloc)

{
  mapped_type pMVar1;
  iterator iVar2;
  MIPMap *pMVar3;
  mapped_type *ppMVar4;
  unique_lock<std::mutex> lock;
  MIPMapFilterOptions filterOptions_local;
  ColorEncodingHandle local_70;
  ColorEncodingHandle local_68;
  TexInfo texInfo;
  
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = 0;
  (this->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (mapping->
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          ).bits;
  this->scale = scale;
  this->invert = invert;
  local_68.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = *(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           *)encoding.
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             .bits;
  filterOptions_local = filterOptions;
  TexInfo::TexInfo(&texInfo,filename,filterOptions,wrapMode,&local_68);
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)textureCacheMutex);
  iVar2 = std::
          _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
          ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                  *)textureCache,&texInfo);
  if (iVar2._M_node == (_Base_ptr)(textureCache + 8)) {
    std::unique_lock<std::mutex>::unlock(&lock);
    local_70.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = *(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              *)encoding.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits;
    pMVar3 = MIPMap::CreateFromFile(filename,&filterOptions_local,wrapMode,&local_70,alloc);
    this->mipmap = pMVar3;
    std::unique_lock<std::mutex>::lock(&lock);
    iVar2 = std::
            _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
            ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                    *)textureCache,&texInfo);
    if (iVar2._M_node != (_Base_ptr)(textureCache + 8)) {
      LogFatal<char_const(&)[49]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.h"
                 ,0x223,"Check failed: %s",
                 (char (*) [49])"textureCache.find(texInfo) == textureCache.end()");
    }
    pMVar1 = this->mipmap;
    ppMVar4 = std::
              map<pbrt::TexInfo,_pbrt::MIPMap_*,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
              ::operator[]((map<pbrt::TexInfo,_pbrt::MIPMap_*,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_pbrt::MIPMap_*>_>_>
                            *)textureCache,&texInfo);
    *ppMVar4 = pMVar1;
  }
  else {
    this->mipmap = (MIPMap *)iVar2._M_node[2]._M_right;
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::__cxx11::string::~string((string *)&texInfo);
  return;
}

Assistant:

ImageTextureBase(TextureMapping2DHandle mapping, std::string filename,
                     MIPMapFilterOptions filterOptions, WrapMode wrapMode, Float scale,
                     bool invert, ColorEncodingHandle encoding, Allocator alloc)
        : mapping(mapping), scale(scale), invert(invert) {
        // Get _MIPMap_ from texture cache if present
        TexInfo texInfo(filename, filterOptions, wrapMode, encoding);
        std::unique_lock<std::mutex> lock(textureCacheMutex);
        if (auto iter = textureCache.find(texInfo); iter != textureCache.end()) {
            mipmap = iter->second;
            return;
        }
        lock.unlock();

        // Create _MIPMap_ for _filename_ and add to texture cache
        mipmap =
            MIPMap::CreateFromFile(filename, filterOptions, wrapMode, encoding, alloc);
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = mipmap;
    }